

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

unsigned_long pybind11::detail::as_unsigned<unsigned_long>(PyObject *o)

{
  long lVar1;
  unsigned_long local_28;
  unsigned_long v;
  PyObject *o_local;
  
  local_28 = PyLong_AsUnsignedLong(o);
  if ((local_28 == 0xffffffffffffffff) && (lVar1 = PyErr_Occurred(), lVar1 != 0)) {
    local_28 = 0xffffffffffffffff;
  }
  return local_28;
}

Assistant:

Unsigned as_unsigned(PyObject *o) {
    if (PYBIND11_SILENCE_MSVC_C4127(sizeof(Unsigned) <= sizeof(unsigned long))
#if PY_VERSION_HEX < 0x03000000
        || PyInt_Check(o)
#endif
    ) {
        unsigned long v = PyLong_AsUnsignedLong(o);
        return v == (unsigned long) -1 && PyErr_Occurred() ? (Unsigned) -1 : (Unsigned) v;
    }
    unsigned long long v = PyLong_AsUnsignedLongLong(o);
    return v == (unsigned long long) -1 && PyErr_Occurred() ? (Unsigned) -1 : (Unsigned) v;
}